

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebox.c
# Opt level: O3

void ecatthread(void *ptr)

{
  long lVar1;
  int iVar2;
  in_EBOX_streamt *piVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  timeval tp;
  timespec local_50;
  timeval local_40;
  
  pthread_mutex_lock((pthread_mutex_t *)&mutex);
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  local_50.tv_nsec =
       (long)((ulong)(uint)((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_40.tv_usec),8)
                                 >> 7) -
                           (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_40.tv_usec),0xc) >>
                           0x1f)) * 0xf424000000000 + 0xf424000000000) >> 0x20;
  iVar2 = *ptr;
  toff = 0;
  dorun = 0;
  uVar4 = 0;
  do {
    do {
      lVar7 = toff + (long)iVar2 * 1000;
      local_50.tv_nsec = lVar7 % 1000000000 + local_50.tv_nsec;
      local_50.tv_sec = lVar7 / 1000000000 + local_40.tv_sec;
      if (1000000000 < local_50.tv_nsec) {
        uVar5 = (ulong)local_50.tv_nsec / 1000000000;
        local_50.tv_nsec = (ulong)local_50.tv_nsec % 1000000000;
        local_50.tv_sec = uVar5 + local_50.tv_sec;
      }
      pthread_cond_timedwait((pthread_cond_t *)&cond,(pthread_mutex_t *)&mutex,&local_50);
      local_40.tv_sec = local_50.tv_sec;
    } while (dorun < 1);
    gettimeofday(&local_40,(__timezone_ptr_t)0x0);
    ec_send_processdata();
    ec_receive_processdata(2000);
    piVar3 = in_EBOX;
    cyclecount = cyclecount + 1;
    if (streampos < 199999 && uVar4 != in_EBOX->counter) {
      uVar6 = uVar4 + 1;
      uVar4 = (uint)in_EBOX->counter;
      if (uVar6 < uVar4) {
        lVar7 = 0;
        do {
          lVar1 = (long)streampos * 2 + lVar7;
          *(undefined2 *)((long)stream1 + lVar1) = 20000;
          *(undefined2 *)((long)stream2 + lVar1) = 0xb1e0;
          lVar7 = lVar7 + 2;
        } while ((int)lVar7 != 100);
      }
      else {
        lVar7 = 0;
        do {
          lVar1 = (long)streampos * 2 + lVar7;
          *(int16 *)((long)stream1 + lVar1) = piVar3->stream[lVar7];
          *(int16 *)((long)stream2 + lVar1) = piVar3->stream[lVar7 + 1];
          lVar7 = lVar7 + 2;
        } while (lVar7 != 100);
      }
      streampos = streampos + 0x32;
    }
    ec_sync(_ec_DCtime,(long)iVar2 * 1000,&toff);
    local_40.tv_sec = local_50.tv_sec;
  } while( true );
}

Assistant:

void ecatthread( void *ptr )
{
   struct timespec   ts;
   struct timeval    tp;
   int rc;
   int ht;
   int i;
   int pcounter = 0;
   int64 cycletime;
   
   rc = pthread_mutex_lock(&mutex);
   rc =  gettimeofday(&tp, NULL);

    /* Convert from timeval to timespec */
   ts.tv_sec  = tp.tv_sec;
   ht = (tp.tv_usec / 1000) + 1; /* round to nearest ms */
   ts.tv_nsec = ht * 1000000;
   cycletime = *(int*)ptr * 1000; /* cycletime in ns */
   toff = 0;
   dorun = 0;
   while(1)
   {   
      /* calculate next cycle start */
      add_timespec(&ts, cycletime + toff);
      /* wait to cycle start */
      rc = pthread_cond_timedwait(&cond, &mutex, &ts);
      if (dorun>0)
      {
         rc =  gettimeofday(&tp, NULL);

         ec_send_processdata();

         ec_receive_processdata(EC_TIMEOUTRET);

         cyclecount++;

         
         if((in_EBOX->counter != pcounter) && (streampos < (MAXSTREAM - 1)))
         {
            // check if we have timing problems in master
            // if so, overwrite stream data so it shows up clearly in plots.
            if(in_EBOX->counter > (pcounter + 1))
            {
               for(i = 0 ; i < 50 ; i++)
               {
                  stream1[streampos]   = 20000;
                  stream2[streampos++] = -20000;
               }
            }
            else
            {
               for(i = 0 ; i < 50 ; i++)
               {
                  stream1[streampos]   = in_EBOX->stream[i * 2];
                  stream2[streampos++] = in_EBOX->stream[(i * 2) + 1];
               }
            }
            pcounter = in_EBOX->counter;
         }
                      
         /* calulate toff to get linux time and DC synced */
         ec_sync(ec_DCtime, cycletime, &toff);
      }   
   }    
}